

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void imdct_step3_iter0_loop(int n,float *e,int i_off,int k_off,float *A)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pfVar1 = e + i_off;
  lVar2 = (long)k_off;
  for (iVar3 = n >> 2; 0 < iVar3; iVar3 = iVar3 + -1) {
    fVar4 = *pfVar1;
    fVar6 = pfVar1[lVar2];
    fVar5 = pfVar1[-1] - pfVar1[lVar2 + -1];
    *pfVar1 = fVar4 + fVar6;
    fVar4 = fVar4 - fVar6;
    pfVar1[-1] = pfVar1[-1] + pfVar1[lVar2 + -1];
    pfVar1[lVar2] = *A * fVar4 - A[1] * fVar5;
    pfVar1[lVar2 + -1] = fVar5 * *A + fVar4 * A[1];
    fVar4 = pfVar1[-2] - pfVar1[lVar2 + -2];
    fVar6 = pfVar1[-3] - pfVar1[lVar2 + -3];
    pfVar1[-2] = pfVar1[-2] + pfVar1[lVar2 + -2];
    pfVar1[-3] = pfVar1[-3] + pfVar1[lVar2 + -3];
    pfVar1[lVar2 + -2] = A[8] * fVar4 - A[9] * fVar6;
    pfVar1[lVar2 + -3] = fVar6 * A[8] + fVar4 * A[9];
    fVar4 = pfVar1[-4];
    fVar6 = pfVar1[lVar2 + -4];
    fVar5 = pfVar1[-5] - pfVar1[lVar2 + -5];
    pfVar1[-4] = fVar4 + fVar6;
    fVar4 = fVar4 - fVar6;
    pfVar1[-5] = pfVar1[-5] + pfVar1[lVar2 + -5];
    pfVar1[lVar2 + -4] = A[0x10] * fVar4 - A[0x11] * fVar5;
    pfVar1[lVar2 + -5] = fVar5 * A[0x10] + fVar4 * A[0x11];
    fVar4 = pfVar1[-6] - pfVar1[lVar2 + -6];
    fVar6 = pfVar1[-7] - pfVar1[lVar2 + -7];
    pfVar1[-6] = pfVar1[-6] + pfVar1[lVar2 + -6];
    pfVar1[-7] = pfVar1[-7] + pfVar1[lVar2 + -7];
    pfVar1[lVar2 + -6] = A[0x18] * fVar4 - A[0x19] * fVar6;
    pfVar1[lVar2 + -7] = fVar6 * A[0x18] + fVar4 * A[0x19];
    A = A + 0x20;
    pfVar1 = pfVar1 + -8;
  }
  return;
}

Assistant:

static void imdct_step3_iter0_loop(int n, float *e, int i_off, int k_off, float *A)
{
   float *ee0 = e + i_off;
   float *ee2 = ee0 + k_off;
   int i;

   assert((n & 3) == 0);
   for (i=(n>>2); i > 0; --i) {
      float k00_20, k01_21;
      k00_20  = ee0[ 0] - ee2[ 0];
      k01_21  = ee0[-1] - ee2[-1];
      ee0[ 0] += ee2[ 0];//ee0[ 0] = ee0[ 0] + ee2[ 0];
      ee0[-1] += ee2[-1];//ee0[-1] = ee0[-1] + ee2[-1];
      ee2[ 0] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-1] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-2] - ee2[-2];
      k01_21  = ee0[-3] - ee2[-3];
      ee0[-2] += ee2[-2];//ee0[-2] = ee0[-2] + ee2[-2];
      ee0[-3] += ee2[-3];//ee0[-3] = ee0[-3] + ee2[-3];
      ee2[-2] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-3] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-4] - ee2[-4];
      k01_21  = ee0[-5] - ee2[-5];
      ee0[-4] += ee2[-4];//ee0[-4] = ee0[-4] + ee2[-4];
      ee0[-5] += ee2[-5];//ee0[-5] = ee0[-5] + ee2[-5];
      ee2[-4] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-5] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-6] - ee2[-6];
      k01_21  = ee0[-7] - ee2[-7];
      ee0[-6] += ee2[-6];//ee0[-6] = ee0[-6] + ee2[-6];
      ee0[-7] += ee2[-7];//ee0[-7] = ee0[-7] + ee2[-7];
      ee2[-6] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-7] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;
      ee0 -= 8;
      ee2 -= 8;
   }
}